

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_date_time(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_date(this,pig);
  if (((bVar1) && (bVar1 = Pig::skip(pig,0x54), bVar1)) &&
     ((bVar1 = parse_time_utc(this,pig), bVar1 ||
      ((bVar1 = parse_time_off(this,pig), bVar1 || (bVar1 = parse_time(this,pig,true), bVar1)))))) {
    this_local._7_1_ = true;
  }
  else {
    Pig::restoreTo(pig,previous);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Datetime::parse_date_time (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_date (pig) &&
      pig.skip ('T')   &&
      (parse_time_utc (pig) ||
       parse_time_off (pig) ||
       parse_time     (pig)))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}